

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O2

EnumDecl * __thiscall SQASTReader::readEnumDecl(SQASTReader *this)

{
  int iVar1;
  SQChar *pSVar2;
  EnumDecl *this_00;
  uint64_t uVar3;
  LiteralExpr *val;
  bool bVar4;
  
  pSVar2 = readString(this);
  iVar1 = (**this->stream->_vptr_InputStream)();
  this_00 = newNode<SQCompilation::EnumDecl,Arena*,char_const*,bool>
                      (this,this->astArena,pSVar2,(char)iVar1 != '\0');
  uVar3 = InputStream::readVaruint(this->stream);
  ArenaVector<SQCompilation::EnumConst>::resize(&this_00->_consts,(size_type_conflict)uVar3);
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    pSVar2 = readString(this);
    val = readNonNullLiteral(this);
    SQCompilation::EnumDecl::addConst(this_00,pSVar2,val);
  }
  return this_00;
}

Assistant:

EnumDecl *SQASTReader::readEnumDecl() {
  const SQChar *name = readString();
  bool isGlobal = stream->readInt8();

  EnumDecl *e = newNode<EnumDecl>(astArena, name, isGlobal);

  size_t size = stream->readUInt64();
  e->consts().resize(size);

  for (size_t i = 0; i < size; ++i) {
    const SQChar *n = readString();
    LiteralExpr *v = readNonNullLiteral();
    e->addConst(n, v);
  }

  return e;
}